

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O2

void __thiscall
absl::inlined_vector_internal::
IteratorValueAdapter<std::allocator<absl::status_internal::Payload>,_std::move_iterator<absl::status_internal::Payload_*>_>
::AssignNext(IteratorValueAdapter<std::allocator<absl::status_internal::Payload>,_std::move_iterator<absl::status_internal::Payload_*>_>
             *this,Pointer<std::allocator<absl::status_internal::Payload>_> assign_at)

{
  status_internal::Payload::operator=(assign_at,(this->it_)._M_current);
  (this->it_)._M_current = (this->it_)._M_current + 1;
  return;
}

Assistant:

void AssignNext(Pointer<A> assign_at) {
    *assign_at = *it_;
    ++it_;
  }